

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FFontChar1::MakeTexture(FFontChar1 *this)

{
  int iVar1;
  BYTE *pBVar2;
  undefined4 extraout_var;
  int local_1c;
  int x;
  BYTE *pix;
  FFontChar1 *this_local;
  
  pBVar2 = (BYTE *)operator_new__((long)(int)((uint)(this->super_FTexture).Width *
                                             (uint)(this->super_FTexture).Height));
  this->Pixels = pBVar2;
  iVar1 = (*this->BaseTexture->_vptr_FTexture[3])();
  if (this->SourceRemap == (BYTE *)0x0) {
    memcpy(this->Pixels,(void *)CONCAT44(extraout_var,iVar1),
           (long)(int)((uint)(this->super_FTexture).Width * (uint)(this->super_FTexture).Height));
  }
  else {
    for (local_1c = 0;
        local_1c < (int)((uint)(this->super_FTexture).Width * (uint)(this->super_FTexture).Height);
        local_1c = local_1c + 1) {
      this->Pixels[local_1c] =
           this->SourceRemap[*(byte *)((long)CONCAT44(extraout_var,iVar1) + (long)local_1c)];
    }
  }
  return;
}

Assistant:

void FFontChar1::MakeTexture ()
{
	// Make the texture as normal, then remap it so that all the colors
	// are at the low end of the palette
	Pixels = new BYTE[Width*Height];
	const BYTE *pix = BaseTexture->GetPixels();

	if (!SourceRemap)
	{
		memcpy(Pixels, pix, Width*Height);
	}
	else
	{
		for (int x = 0; x < Width*Height; ++x)
		{
			Pixels[x] = SourceRemap[pix[x]];
		}
	}
}